

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  int iVar2;
  uv__work *ptr;
  iovec *piVar3;
  _func_void_uv__work_ptr_int *p_Var4;
  double dVar5;
  bool bVar6;
  uv_dirent_type_t uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  ssize_t sVar13;
  size_t sVar14;
  _func_void_uv__work_ptr *p_Var15;
  dirent64 *dent;
  char *pcVar16;
  _func_void_uv__work_ptr *p_Var17;
  DIR *pDVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  iovec *iov;
  code *pcVar22;
  _func_void_uv__work_ptr_int *p_Var23;
  uint uVar24;
  long lVar25;
  size_t sVar26;
  _func_void_uv__work_ptr_int *p_Var27;
  _func_void_uv__work_ptr_int *p_StackY_2220;
  uint local_2210;
  pollfd pfd;
  __ino_t local_21c8;
  __mode_t local_21b8;
  size_t local_21a0;
  stat dst_statsbuf;
  statfs64 local_20b0;
  uv_fs_t fs_req;
  
  iVar1 = *(int *)&w[-7].done;
  puVar12 = (uint *)__errno_location();
  buf = &w[-6].loop;
LAB_0010e7bf:
  *puVar12 = 0;
  switch(*(undefined4 *)&w[-7].done) {
  case 1:
    iVar8 = open64((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                   (ulong)*(uint *)(w[-2].wq + 1));
    break;
  case 2:
    iVar8 = uv__close_nocancel(*(int *)w[-2].wq);
    if (iVar8 == -1) {
      iVar8 = -(uint)(*puVar12 != 0x73 && *puVar12 != 4);
    }
    break;
  case 3:
    uVar24 = uv__getiovmax();
    uVar11 = *(uint *)((long)w[-2].wq + 0xc);
    if (uVar24 < uVar11) {
      *(uint *)((long)w[-2].wq + 0xc) = uVar24;
      uVar11 = uVar24;
    }
    p_Var27 = w[-1].done;
    if ((long)p_Var27 < 0) {
      piVar3 = (iovec *)w[-1].work;
      if (uVar11 == 1) {
        p_StackY_2220 =
             (_func_void_uv__work_ptr_int *)read(*(int *)w[-2].wq,piVar3->iov_base,piVar3->iov_len);
      }
      else {
        p_StackY_2220 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,piVar3,uVar11);
      }
    }
    else if (uVar11 == 1) {
      p_StackY_2220 =
           (_func_void_uv__work_ptr_int *)
           pread64(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                   (__off64_t)p_Var27);
    }
    else if (uv__fs_read_no_preadv == '\x01') {
LAB_0010f26e:
      if (uVar11 == 0) {
        __assert_fail("nbufs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/fs.c"
                      ,0x184,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
      }
      iVar8 = *(int *)w[-2].wq;
      p_Var17 = w[-1].work;
      p_Var15 = p_Var17 + (ulong)uVar11 * 0x10;
      p_StackY_2220 = (_func_void_uv__work_ptr_int *)0x0;
      do {
        uVar20 = 0;
        do {
          while (sVar13 = pread64(iVar8,(void *)(*(long *)p_Var17 + uVar20),
                                  *(long *)(p_Var17 + 8) - uVar20,
                                  (__off64_t)(p_StackY_2220 + (long)p_Var27)), sVar13 == -1) {
            if ((long)(int)*puVar12 != 4) {
              if (p_StackY_2220 == (_func_void_uv__work_ptr_int *)0x0) {
                p_StackY_2220 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar12;
              }
              goto LAB_0010f426;
            }
          }
          if (sVar13 == 0) goto LAB_0010f426;
          uVar20 = uVar20 + sVar13;
          p_StackY_2220 = p_StackY_2220 + sVar13;
        } while (uVar20 < *(ulong *)(p_Var17 + 8));
        p_Var17 = p_Var17 + 0x10;
      } while (p_Var17 != p_Var15);
    }
    else {
      p_StackY_2220 =
           (_func_void_uv__work_ptr_int *)
           uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,uVar11,(int64_t)p_Var27);
      if (p_StackY_2220 == (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
        if (*puVar12 == 0x26) {
          uv__fs_read_no_preadv = '\x01';
          uVar11 = *(uint *)((long)w[-2].wq + 0xc);
          p_Var27 = w[-1].done;
          goto LAB_0010f26e;
        }
        p_StackY_2220 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
    }
LAB_0010f426:
    if ((uv__work *)w[-1].work != w + 1) {
      uv__free((uv__work *)w[-1].work);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    goto LAB_0010eff5;
  case 4:
    uVar24 = uv__getiovmax();
    uVar11 = *(uint *)((long)w[-2].wq + 0xc);
    ptr = (uv__work *)w[-1].work;
    p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
LAB_0010ea4a:
    if (uVar11 != 0) {
      uVar10 = uVar24;
      if (uVar11 < uVar24) {
        uVar10 = uVar11;
      }
      *(uint *)((long)w[-2].wq + 0xc) = uVar10;
      do {
        p_Var23 = w[-1].done;
        if ((long)p_Var23 < 0) {
          piVar3 = (iovec *)w[-1].work;
          if (uVar10 == 1) {
            p_StackY_2220 =
                 (_func_void_uv__work_ptr_int *)
                 write(*(int *)w[-2].wq,piVar3->iov_base,piVar3->iov_len);
          }
          else {
            p_StackY_2220 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,piVar3,uVar10);
          }
LAB_0010eac0:
          if (-1 < (long)p_StackY_2220) goto LAB_0010eafc;
          uVar10 = *puVar12;
        }
        else {
          iov = (iovec *)w[-1].work;
          if ((uVar10 == 1) || (uv__fs_write_no_pwritev == '\x01')) {
LAB_0010ea7a:
            p_StackY_2220 =
                 (_func_void_uv__work_ptr_int *)
                 pwrite64(*(int *)w[-2].wq,iov->iov_base,iov->iov_len,(__off64_t)p_Var23);
            goto LAB_0010eac0;
          }
          p_StackY_2220 =
               (_func_void_uv__work_ptr_int *)
               uv__pwritev(*(int *)w[-2].wq,iov,uVar10,(int64_t)p_Var23);
          if (p_StackY_2220 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_0010eac0;
          uVar10 = *puVar12;
          if (uVar10 == 0x26) {
            uv__fs_write_no_pwritev = '\x01';
            iov = (iovec *)w[-1].work;
            p_Var23 = w[-1].done;
            goto LAB_0010ea7a;
          }
          p_StackY_2220 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        }
        if (uVar10 != 4) goto LAB_0010f68b;
        uVar10 = *(uint *)((long)w[-2].wq + 0xc);
      } while( true );
    }
LAB_0010f692:
    if (ptr != w + 1) {
      uv__free(ptr);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    p_StackY_2220 = p_Var27;
    goto LAB_0010eff5;
  case 5:
    dst_statsbuf.st_dev = (__dev_t)w[-1].done;
    sVar13 = sendfile64(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(__off64_t *)&dst_statsbuf,
                        (size_t)w[1].done);
    p_Var27 = w[-1].done;
    p_StackY_2220 = (_func_void_uv__work_ptr_int *)(dst_statsbuf.st_dev - (long)p_Var27);
    if ((p_StackY_2220 == (_func_void_uv__work_ptr_int *)0x0 ||
        (long)dst_statsbuf.st_dev < (long)p_Var27) && sVar13 == -1) {
      uVar11 = *puVar12;
      if (((uVar11 < 0x17) && ((0x440020U >> (uVar11 & 0x1f) & 1) != 0)) || (uVar11 == 0x58)) {
        bVar6 = true;
        *puVar12 = 0;
        p_Var23 = w[1].done;
        iVar8 = *(int *)w[-2].wq;
        iVar2 = *(int *)((long)w[-2].wq + 4);
        p_StackY_2220 = (_func_void_uv__work_ptr_int *)0x0;
LAB_0010f07b:
        for (; uVar20 = (long)p_Var23 - (long)p_StackY_2220, p_StackY_2220 <= p_Var23 && uVar20 != 0
            ; p_StackY_2220 = p_StackY_2220 + lVar25) {
          sVar19 = 0x2000;
          if (uVar20 < 0x2000) {
            sVar19 = uVar20;
          }
          while( true ) {
            if (bVar6) {
              lVar25 = pread64(iVar2,&fs_req,sVar19,(__off64_t)p_Var27);
            }
            else {
              lVar25 = read(iVar2,&fs_req,sVar19);
            }
            if (lVar25 != -1) break;
            uVar11 = *puVar12;
            if (uVar11 != 4) goto code_r0x0010f0d3;
          }
          if (lVar25 == 0) break;
          for (lVar21 = 0; lVar25 - lVar21 != 0 && lVar21 <= lVar25; lVar21 = lVar21 + sVar13) {
            while (sVar13 = write(iVar8,(void *)((long)fs_req.reserved + lVar21 + -0x10),
                                  lVar25 - lVar21), sVar13 == -1) {
              if (*puVar12 != 4) {
                if (*puVar12 != 0xb) goto LAB_0010f4f4;
                pfd.events = 4;
                pfd.revents = 0;
                pfd.fd = iVar8;
                while (iVar9 = poll((pollfd *)&pfd,1,-1), iVar9 == -1) {
                  if (*puVar12 != 4) goto LAB_0010f4e0;
                }
                if ((pfd.revents & 0xfffbU) != 0) {
LAB_0010f4e0:
                  *puVar12 = 5;
                  goto LAB_0010f4f4;
                }
              }
            }
          }
          p_Var27 = p_Var27 + lVar25;
        }
        if (p_StackY_2220 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_0010f415;
      }
LAB_0010f73d:
      p_StackY_2220 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    }
    else {
      w[-1].done = (_func_void_uv__work_ptr_int *)dst_statsbuf.st_dev;
    }
    goto LAB_0010eff5;
  case 6:
    p_Var27 = w[-6].done;
    iVar8 = uv__fs_statx(-1,(char *)p_Var27,0,0,(uv_stat_t *)buf);
    if (iVar8 == -0x26) {
      iVar8 = stat64((char *)p_Var27,(stat64 *)&fs_req);
LAB_0010edd0:
      if (iVar8 == 0) {
        uv__to_stat((stat *)&fs_req,(uv_stat_t *)buf);
        iVar8 = 0;
      }
    }
    break;
  case 7:
    p_Var27 = w[-6].done;
    iVar8 = uv__fs_statx(-1,(char *)p_Var27,0,1,(uv_stat_t *)buf);
    if (iVar8 == -0x26) {
      iVar8 = lstat64((char *)p_Var27,(stat64 *)&fs_req);
      goto LAB_0010edd0;
    }
    break;
  case 8:
    iVar2 = *(int *)w[-2].wq;
    iVar8 = uv__fs_statx(iVar2,"",1,0,(uv_stat_t *)buf);
    if ((iVar8 == -0x26) && (iVar8 = fstat64(iVar2,(stat64 *)&fs_req), iVar8 == 0)) {
      uv__to_stat((stat *)&fs_req,(uv_stat_t *)buf);
      iVar8 = 0;
    }
    break;
  case 9:
    iVar8 = ftruncate64(*(int *)w[-2].wq,(__off64_t)w[-1].done);
    break;
  case 10:
    fs_req.data = (void *)(long)(double)w[-1].wq[0];
    dVar5 = (double)w[-1].wq[0] * 1000000.0;
    uVar20 = (ulong)dVar5;
    fs_req._8_8_ = (((long)(dVar5 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) %
                   1000000) * 1000;
    fs_req.reserved[0] = (void *)(long)(double)w[-1].wq[1];
    dVar5 = (double)w[-1].wq[1] * 1000000.0;
    uVar20 = (ulong)dVar5;
    fs_req.reserved[1] =
         (void *)((((long)(dVar5 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) % 1000000
                  ) * 1000);
    iVar8 = utimensat(-100,(char *)w[-6].done,(timespec *)&fs_req,0);
    break;
  case 0xb:
    fs_req.data = (void *)(long)(double)w[-1].wq[0];
    dVar5 = (double)w[-1].wq[0] * 1000000.0;
    uVar20 = (ulong)dVar5;
    fs_req._8_8_ = (((long)(dVar5 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) %
                   1000000) * 1000;
    fs_req.reserved[0] = (void *)(long)(double)w[-1].wq[1];
    dVar5 = (double)w[-1].wq[1] * 1000000.0;
    uVar20 = (ulong)dVar5;
    fs_req.reserved[1] =
         (void *)((((long)(dVar5 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) % 1000000
                  ) * 1000);
    iVar8 = futimens(*(int *)w[-2].wq,(timespec *)&fs_req);
    break;
  case 0xc:
    iVar8 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
    break;
  case 0xd:
    iVar8 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xe:
    iVar8 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xf:
    iVar8 = fsync(*(int *)w[-2].wq);
    break;
  case 0x10:
    iVar8 = fdatasync(*(int *)w[-2].wq);
    break;
  case 0x11:
    iVar8 = unlink((char *)w[-6].done);
    break;
  case 0x12:
    iVar8 = rmdir((char *)w[-6].done);
    break;
  case 0x13:
    iVar8 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0x14:
    pcVar16 = mkdtemp((char *)w[-6].done);
    p_StackY_2220 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar16 == (char *)0x0);
    goto LAB_0010eff5;
  case 0x15:
    iVar8 = rename((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x16:
    fs_req.data = (void *)0x0;
    uVar11 = scandir64((char *)w[-6].done,(dirent64 ***)&fs_req,uv__fs_scandir_filter,
                       uv__fs_scandir_sort);
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    if (uVar11 != 0xffffffff) {
      p_Var17 = (_func_void_uv__work_ptr *)fs_req.data;
      if (uVar11 == 0) {
        free(fs_req.data);
        p_Var17 = (_func_void_uv__work_ptr *)0x0;
      }
      w[-6].work = p_Var17;
      goto LAB_0010f23e;
    }
LAB_0010f3ea:
    p_StackY_2220 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    goto LAB_0010eff5;
  case 0x17:
    iVar8 = link((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x18:
    iVar8 = symlink((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x19:
    sVar14 = pathconf((char *)w[-6].done,4);
    sVar26 = 0x100;
    if (sVar14 != 0xffffffffffffffff) {
      sVar26 = sVar14;
    }
    p_Var15 = (_func_void_uv__work_ptr *)uv__malloc(sVar26);
    if (p_Var15 == (_func_void_uv__work_ptr *)0x0) {
      *puVar12 = 0xc;
    }
    else {
      sVar14 = readlink((char *)w[-6].done,(char *)p_Var15,sVar26);
      if ((sVar14 != 0xffffffffffffffff) &&
         ((p_Var17 = p_Var15, sVar14 != sVar26 ||
          (p_Var17 = (_func_void_uv__work_ptr *)uv__realloc(p_Var15,sVar26 + 1), sVar14 = sVar26,
          p_Var17 != (_func_void_uv__work_ptr *)0x0)))) {
        p_Var17[sVar14] = (_func_void_uv__work_ptr)0x0;
        goto LAB_0010f7d5;
      }
      uv__free(p_Var15);
    }
    goto LAB_0010efff;
  case 0x1a:
    iVar8 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1b:
    iVar8 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1c:
    p_Var17 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
    if (p_Var17 != (_func_void_uv__work_ptr *)0x0) goto LAB_0010f7d5;
    goto LAB_0010efff;
  case 0x1d:
    uVar11 = uv_fs_open((uv_loop_t *)0x0,&fs_req,(char *)w[-6].done,0,0,(uv_fs_cb)0x0);
    uv_fs_req_cleanup(&fs_req);
    if (-1 < (int)uVar11) {
      iVar8 = fstat64(uVar11,(stat64 *)&pfd);
      if (iVar8 == 0) {
        uVar10 = uv_fs_open((uv_loop_t *)0x0,&fs_req,(char *)w[-2].loop,
                            (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x241,local_21b8,
                            (uv_fs_cb)0x0);
        uv_fs_req_cleanup(&fs_req);
        uVar24 = uVar10;
        if (-1 < (int)uVar10) {
          iVar8 = fstat64(uVar10,(stat64 *)&dst_statsbuf);
          if (iVar8 != 0) {
            uVar20 = (ulong)-*puVar12;
LAB_0010f371:
            uVar24 = (uint)uVar20;
            goto LAB_0010f37b;
          }
          if ((CONCAT26(pfd.revents,CONCAT24(pfd.events,pfd.fd)) != dst_statsbuf.st_dev) ||
             (local_21c8 != dst_statsbuf.st_ino)) {
            iVar8 = fchmod(uVar10,local_21b8);
            if (iVar8 == -1) {
              uVar24 = *puVar12;
              if (uVar24 == 1) {
                iVar8 = fstatfs64(uVar10,&local_20b0);
                uVar24 = 0xffffffff;
                if ((iVar8 == -1) || (local_20b0.f_type != 0xff534d42)) goto LAB_0010f38a;
                goto LAB_0010f5ff;
              }
LAB_0010f71d:
              uVar24 = -uVar24;
              goto LAB_0010f37b;
            }
LAB_0010f5ff:
            if (((ulong)w[-2].wq[0] & 0x600000000) != 0) {
              iVar8 = ioctl(uVar10,0x40049409,(ulong)uVar11);
              uVar24 = 0;
              if (iVar8 == 0) goto LAB_0010f38a;
              if (((ulong)w[-2].wq[0] & 0x400000000) != 0) {
                uVar24 = *puVar12;
                goto LAB_0010f71d;
              }
            }
            lVar25 = 0;
            for (sVar26 = local_21a0; sVar26 != 0; sVar26 = sVar26 - uVar20) {
              uv_fs_sendfile((uv_loop_t *)0x0,&fs_req,uVar10,uVar11,lVar25,sVar26,(uv_fs_cb)0x0);
              uVar20 = fs_req.result;
              uv_fs_req_cleanup(&fs_req);
              if ((long)uVar20 < 0) goto LAB_0010f371;
              lVar25 = lVar25 + uVar20;
            }
          }
          uVar24 = 0;
        }
      }
      else {
        uVar24 = -*puVar12;
        uVar10 = 0xffffffff;
LAB_0010f37b:
        uVar24 = (int)uVar24 >> 0x1f & uVar24;
      }
LAB_0010f38a:
      uVar11 = uv__close_nocheckstdio(uVar11);
      if (uVar11 == 0) {
        uVar11 = uVar24;
      }
      if (uVar24 != 0) {
        uVar11 = uVar24;
      }
      if ((int)uVar10 < 0) {
        if (uVar11 == 0) goto LAB_0010f3f0;
      }
      else {
        uVar24 = uv__close_nocheckstdio(uVar10);
        if (uVar24 == 0) {
          uVar24 = uVar11;
        }
        if (uVar11 == 0) {
          uVar11 = uVar24;
        }
        if (uVar11 == 0) {
LAB_0010f3f0:
          p_StackY_2220 = (_func_void_uv__work_ptr_int *)0x0;
          goto LAB_0010eff5;
        }
        uv_fs_unlink((uv_loop_t *)0x0,&fs_req,(char *)w[-2].loop,(uv_fs_cb)0x0);
        uv_fs_req_cleanup(&fs_req);
      }
      *puVar12 = -uVar11;
      goto LAB_0010f3ea;
    }
    goto LAB_0010f23e;
  case 0x1e:
    iVar8 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1f:
    p_Var17 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
    if (p_Var17 == (_func_void_uv__work_ptr *)0x0) {
LAB_0010f01e:
      uv__free(p_Var17);
      p_StackY_2220 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      p_Var17 = (_func_void_uv__work_ptr *)0x0;
    }
    else {
      pDVar18 = opendir((char *)w[-6].done);
      *(DIR **)(p_Var17 + 0x30) = pDVar18;
      if (pDVar18 == (DIR *)0x0) goto LAB_0010f01e;
      p_StackY_2220 = (_func_void_uv__work_ptr_int *)0x0;
    }
    w[-6].work = p_Var17;
    goto LAB_0010eff5;
  case 0x20:
    p_Var17 = w[-6].work;
    local_2210 = 0;
    while( true ) {
      uVar20 = (ulong)local_2210;
      do {
        if (*(ulong *)(p_Var17 + 8) <= uVar20) goto LAB_0010f24d;
        *puVar12 = 0;
        dent = readdir64(*(DIR **)(p_Var17 + 0x30));
        if (dent == (dirent64 *)0x0) {
          if (*puVar12 != 0) goto LAB_0010f1d3;
          goto LAB_0010f24d;
        }
      } while ((dent->d_name[0] == '.') &&
              ((dent->d_name[1] == '\0' || ((dent->d_name[1] == '.' && (dent->d_name[2] == '\0')))))
              );
      lVar25 = *(long *)p_Var17;
      pcVar16 = uv__strdup(dent->d_name);
      *(char **)(lVar25 + uVar20 * 0x10) = pcVar16;
      if (pcVar16 == (char *)0x0) break;
      uVar7 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
      *(uv_dirent_type_t *)(lVar25 + uVar20 * 0x10 + 8) = uVar7;
      local_2210 = local_2210 + 1;
    }
LAB_0010f1d3:
    for (lVar25 = 0; uVar20 << 4 != lVar25; lVar25 = lVar25 + 0x10) {
      uv__free(*(void **)(*(long *)p_Var17 + lVar25));
      *(undefined8 *)(*(long *)p_Var17 + lVar25) = 0;
    }
    local_2210 = 0xffffffff;
LAB_0010f24d:
    p_StackY_2220 = (_func_void_uv__work_ptr_int *)(long)(int)local_2210;
    goto LAB_0010eff5;
  case 0x21:
    p_Var17 = w[-6].work;
    if (*(DIR **)(p_Var17 + 0x30) != (DIR *)0x0) {
      closedir(*(DIR **)(p_Var17 + 0x30));
      *(undefined8 *)(p_Var17 + 0x30) = 0;
      p_Var17 = w[-6].work;
    }
    uv__free(p_Var17);
    p_Var17 = (_func_void_uv__work_ptr *)0x0;
LAB_0010f7d5:
    w[-6].work = p_Var17;
    w[-7].wq[1] = (void *)0x0;
    goto LAB_0010f76e;
  case 0x22:
    iVar8 = statfs64((char *)w[-6].done,(statfs64 *)&fs_req);
    p_StackY_2220 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    if (iVar8 == 0) {
      p_Var17 = (_func_void_uv__work_ptr *)uv__malloc(0x58);
      if (p_Var17 == (_func_void_uv__work_ptr *)0x0) {
        *puVar12 = 0xc;
      }
      else {
        *(void **)p_Var17 = fs_req.data;
        *(undefined8 *)(p_Var17 + 8) = fs_req._8_8_;
        *(void **)(p_Var17 + 0x10) = fs_req.reserved[0];
        *(void **)(p_Var17 + 0x18) = fs_req.reserved[1];
        *(void **)(p_Var17 + 0x20) = fs_req.reserved[2];
        *(void **)(p_Var17 + 0x28) = fs_req.reserved[3];
        *(void **)(p_Var17 + 0x30) = fs_req.reserved[4];
        w[-6].work = p_Var17;
        p_StackY_2220 = (_func_void_uv__work_ptr_int *)0x0;
      }
    }
    goto LAB_0010eff5;
  case 0x23:
    p_Var27 = w[-6].done;
    sVar19 = strlen((char *)p_Var27);
    if ((sVar19 < 6) || (iVar8 = strcmp((char *)(p_Var27 + (sVar19 - 6)),"XXXXXX"), iVar8 != 0)) {
      *puVar12 = 0x16;
      uVar11 = 0xffffffff;
    }
    else {
      uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
      if (uv__mkostemp != (_func_int_char_ptr_int *)0x0 &&
          (uv__fs_mkstemp_no_cloexec_support & 1) == 0) {
        uVar11 = (*uv__mkostemp)((char *)p_Var27,0x80000);
        if ((-1 < (int)uVar11) || (*puVar12 != 0x16)) goto LAB_0010f23e;
        uv__fs_mkstemp_no_cloexec_support = 1;
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
      }
      uVar11 = mkstemp64((char *)p_Var27);
      if ((-1 < (int)uVar11) && (iVar8 = uv__cloexec_ioctl(uVar11,1), iVar8 != 0)) {
        iVar8 = uv__close(uVar11);
        if (iVar8 != 0) {
switchD_0010e7e0_default:
          abort();
        }
        uVar11 = 0xffffffff;
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
      }
    }
LAB_0010f23e:
    p_StackY_2220 = (_func_void_uv__work_ptr_int *)(long)(int)uVar11;
    goto LAB_0010eff5;
  default:
    goto switchD_0010e7e0_default;
  }
  p_StackY_2220 = (_func_void_uv__work_ptr_int *)(long)iVar8;
  goto LAB_0010eff5;
code_r0x0010f0d3:
  if ((p_StackY_2220 != (_func_void_uv__work_ptr_int *)0x0) || (!bVar6)) {
    if (p_StackY_2220 + 1 < (code *)0x2) goto LAB_0010f73d;
LAB_0010f415:
    w[-1].done = p_Var27;
    goto LAB_0010eff5;
  }
  p_StackY_2220 = (_func_void_uv__work_ptr_int *)0x0;
  bVar6 = false;
  if ((uVar11 == 5) || (uVar11 == 0x1d)) goto LAB_0010f07b;
LAB_0010f4f4:
  p_StackY_2220 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
LAB_0010eff5:
  if (p_StackY_2220 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
    w[-7].wq[1] = p_StackY_2220;
    if (p_StackY_2220 != (_func_void_uv__work_ptr_int *)0x0) {
      return;
    }
LAB_0010f76e:
    if (2 < *(int *)&w[-7].done - 6U) {
      return;
    }
    w[-6].work = (_func_void_uv__work_ptr *)buf;
    return;
  }
LAB_0010efff:
  if ((0xfffffffd < iVar1 - 4U) || (*puVar12 != 4)) {
    w[-7].wq[1] = (void *)-(long)(int)*puVar12;
    return;
  }
  goto LAB_0010e7bf;
LAB_0010eafc:
  if (p_StackY_2220 == (_func_void_uv__work_ptr_int *)0x0) {
    p_StackY_2220 = (_func_void_uv__work_ptr_int *)0x0;
LAB_0010f68b:
    if (p_Var27 == (_func_void_uv__work_ptr_int *)0x0) {
      p_Var27 = p_StackY_2220;
    }
    goto LAB_0010f692;
  }
  if (-1 < (long)w[-1].done) {
    w[-1].done = w[-1].done + (long)p_StackY_2220;
  }
  p_Var17 = w[-1].work;
  pcVar22 = p_Var17 + 8;
  uVar10 = 0;
  for (p_Var23 = p_StackY_2220; p_Var23 != (_func_void_uv__work_ptr_int *)0x0;
      p_Var23 = p_Var23 + -(long)p_Var4) {
    p_Var4 = *(_func_void_uv__work_ptr_int **)pcVar22;
    if (p_Var23 <= p_Var4 && (long)p_Var4 - (long)p_Var23 != 0) {
      *(_func_void_uv__work_ptr_int **)(pcVar22 + -8) = p_Var23 + *(ulong *)(pcVar22 + -8);
      *(long *)pcVar22 = (long)p_Var4 - (long)p_Var23;
      break;
    }
    uVar10 = uVar10 + 1;
    pcVar22 = pcVar22 + 0x10;
  }
  *(uint *)((long)w[-2].wq + 0xc) = uVar10;
  w[-1].work = p_Var17 + (ulong)uVar10 * 0x10;
  uVar11 = uVar11 - uVar10;
  p_Var27 = p_Var27 + (long)p_StackY_2220;
  goto LAB_0010ea4a;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}